

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O2

void __thiscall TCLAP::StdOutput::version(StdOutput *this,CmdLineInterface *_cmd)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar2;
  string xversion;
  string progName;
  string asStack_48 [32];
  string local_28 [32];
  
  iVar1 = (*_cmd->_vptr_CmdLineInterface[10])(_cmd);
  std::__cxx11::string::string(local_28,(string *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*_cmd->_vptr_CmdLineInterface[9])(_cmd);
  std::__cxx11::string::string(asStack_48,(string *)CONCAT44(extraout_var_00,iVar1));
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<(poVar2,local_28);
  poVar2 = std::operator<<(poVar2,"  version: ");
  poVar2 = std::operator<<(poVar2,asStack_48);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(asStack_48);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

inline void StdOutput::version(CmdLineInterface& _cmd) 
{
	std::string progName = _cmd.getProgramName();
	std::string xversion = _cmd.getVersion();

	std::cout << std::endl << progName << "  version: " 
			  << xversion << std::endl << std::endl;
}